

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O0

void GB(uint64_t *a,uint64_t *b,uint64_t *c,uint64_t *d)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t *d_local;
  uint64_t *c_local;
  uint64_t *b_local;
  uint64_t *a_local;
  
  uVar3 = *b;
  uVar1 = trunc32(*a);
  uVar2 = trunc32(*b);
  *a = uVar3 + uVar1 * 2 * uVar2 + *a;
  uVar3 = ror(*d ^ *a,0x20);
  *d = uVar3;
  uVar3 = *d;
  uVar1 = trunc32(*c);
  uVar2 = trunc32(*d);
  *c = uVar3 + uVar1 * 2 * uVar2 + *c;
  uVar3 = ror(*b ^ *c,0x18);
  *b = uVar3;
  uVar3 = *b;
  uVar1 = trunc32(*a);
  uVar2 = trunc32(*b);
  *a = uVar3 + uVar1 * 2 * uVar2 + *a;
  uVar3 = ror(*d ^ *a,0x10);
  *d = uVar3;
  uVar3 = *d;
  uVar1 = trunc32(*c);
  uVar2 = trunc32(*d);
  *c = uVar3 + uVar1 * 2 * uVar2 + *c;
  uVar3 = ror(*b ^ *c,0x3f);
  *b = uVar3;
  return;
}

Assistant:

static inline void GB(uint64_t *a, uint64_t *b, uint64_t *c, uint64_t *d)
{
    *a += *b + 2 * trunc32(*a) * trunc32(*b);
    *d = ror(*d ^ *a, 32);
    *c += *d + 2 * trunc32(*c) * trunc32(*d);
    *b = ror(*b ^ *c, 24);
    *a += *b + 2 * trunc32(*a) * trunc32(*b);
    *d = ror(*d ^ *a, 16);
    *c += *d + 2 * trunc32(*c) * trunc32(*d);
    *b = ror(*b ^ *c, 63);
}